

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O1

int gdGetIntLSB(int *result,gdIOCtx *ctx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = (*ctx->getC)(ctx);
  iVar3 = 0;
  iVar5 = 0;
  if (uVar1 != 0xffffffff) {
    iVar2 = (*ctx->getC)(ctx);
    iVar5 = iVar3;
    if (iVar2 != -1) {
      iVar3 = (*ctx->getC)(ctx);
      if (iVar3 != -1) {
        iVar4 = (*ctx->getC)(ctx);
        if ((iVar4 != -1) && (iVar5 = 1, result != (int *)0x0)) {
          *result = iVar4 << 0x18 |
                    (iVar3 << 0x18 | (iVar2 << 0x18 | (uVar1 & 0xff) << 0x10) >> 8) >> 8;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int gdGetIntLSB(signed int *result, gdIOCtx *ctx)
{
	int c = 0;
	unsigned int r = 0;

	c = (ctx->getC) (ctx);
	if (c == EOF) {
		return 0;
	}
	r |= (c << 24);
	r >>= 8;

	c = (ctx->getC) (ctx);
	if (c == EOF) {
		return 0;
	}
	r |= (c << 24);
	r >>= 8;

	c = (ctx->getC) (ctx);
	if (c == EOF) {
		return 0;
	}
	r |= (c << 24);
	r >>= 8;

	c = (ctx->getC) (ctx);
	if (c == EOF) {
		return 0;
	}
	r |= (c << 24);

	if (result) {
		*result = (signed int)r;
	}

	return 1;
}